

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O2

void __thiscall Unit::dimensionless(Unit *this)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  
  setNames(this);
  bVar1 = false;
  for (lVar3 = 1; lVar3 != 8; lVar3 = lVar3 + 1) {
    bVar1 = (bool)(bVar1 | this->siUnits[lVar3 + -1] != 0);
    this->siUnits[lVar3 + -1] = 0;
  }
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"warning: using(");
    poVar2 = std::operator<<(poVar2,(string *)&this->sUnitName);
    poVar2 = std::operator<<(poVar2,") as argument to a dimensionless function.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  setNames(this);
  return;
}

Assistant:

void Unit::dimensionless()
{
	setNames();
	bool warning = false;
	for(int i=0; i<7; i++) {
		if (siUnits[i])
			warning = true;
		siUnits[i] = 0;
	}
	if (warning)
		cout << "warning: using(" << sUnitName << ") as argument to a dimensionless function." << endl;
	setNames();
}